

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c++
# Opt level: O3

Promise<unsigned_long> __thiscall
kj::anon_unknown_36::HttpOutputStream::pumpBodyFrom
          (HttpOutputStream *this,AsyncInputStream *input,uint64_t amount)

{
  Coroutine<unsigned_long> *this_00;
  PromiseAwaiter<void> *this_01;
  Promise<unsigned_long> *promise;
  PromiseAwaiter<unsigned_long> *__return_storage_ptr__;
  byte bVar1;
  PromiseArenaMember *pPVar2;
  long *plVar3;
  SourceLocation location;
  Fault node;
  bool bVar4;
  coroutine_handle<void> coroutine;
  unsigned_long uVar5;
  undefined8 in_RCX;
  Fault f;
  DebugExpression<bool> _kjCondition;
  char *local_58;
  char *pcStack_50;
  _func_int **local_48;
  DebugExpression<bool> local_40;
  Event *local_38;
  
  coroutine._M_fr_ptr = operator_new(0x640);
  *(code **)coroutine._M_fr_ptr = pumpBodyFrom;
  *(code **)((long)coroutine._M_fr_ptr + 8) = pumpBodyFrom;
  this_00 = (Coroutine<unsigned_long> *)((long)coroutine._M_fr_ptr + 0x10);
  *(undefined8 *)((long)coroutine._M_fr_ptr + 0x630) = in_RCX;
  *(uint64_t *)((long)coroutine._M_fr_ptr + 0x628) = amount;
  *(AsyncInputStream **)((long)coroutine._M_fr_ptr + 0x620) = input;
  local_58 = 
  "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/compat/http.c++"
  ;
  pcStack_50 = "pumpBodyFrom";
  local_48 = (_func_int **)0x1500000906;
  *(undefined ***)((long)coroutine._M_fr_ptr + 0x10) = &PTR_destroy_006da7a0;
  *(undefined ***)((long)coroutine._M_fr_ptr + 0x20) = &PTR_traceEvent_006da7e8;
  location.function = "pumpBodyFrom";
  location.fileName =
       "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/compat/http.c++"
  ;
  location.lineNumber = 0x906;
  location.columnNumber = 0x15;
  kj::_::CoroutineBase::CoroutineBase
            ((CoroutineBase *)this_00,coroutine,
             (ExceptionOrValue *)((long)coroutine._M_fr_ptr + 0x98),location);
  *(undefined ***)((long)coroutine._M_fr_ptr + 0x10) = &PTR_destroy_006da7a0;
  *(undefined ***)((long)coroutine._M_fr_ptr + 0x20) = &PTR_traceEvent_006da7e8;
  *(undefined1 *)((long)coroutine._M_fr_ptr + 0x98) = 0;
  *(undefined1 *)((long)coroutine._M_fr_ptr + 0x230) = 0;
  (this->super_WrappableStreamMixin<kj::(anonymous_namespace)::HttpOutputStream>).currentWrapper.ptr
       = (Maybe<kj::(anonymous_namespace)::HttpOutputStream_&> *)this_00;
  bVar1 = *(byte *)((long)&input[3]._vptr_AsyncInputStream + 2);
  local_40.value = (bool)(bVar1 ^ 1);
  local_38 = (Event *)this;
  if (bVar1 != 0) {
    kj::_::Debug::Fault::Fault<kj::Exception::Type,kj::_::DebugExpression<bool>&,char_const(&)[32]>
              ((Fault *)&stack0xffffffffffffffa8,
               "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/compat/http.c++"
               ,0x907,FAILED,"!writeInProgress","_kjCondition,\"concurrent write()s not allowed\"",
               &stack0xffffffffffffffc0,(char (*) [32])"concurrent write()s not allowed");
    kj::_::Debug::Fault::fatal((Fault *)&stack0xffffffffffffffa8);
  }
  local_58 = (char *)(input + 3);
  if (*(char *)&input[3]._vptr_AsyncInputStream != '\0') {
    *(undefined1 *)((long)&input[3]._vptr_AsyncInputStream + 2) = 1;
    *(char **)((long)coroutine._M_fr_ptr + 0x5e8) =
         "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/compat/http.c++"
    ;
    *(char **)((long)coroutine._M_fr_ptr + 0x5f0) = "pumpBodyFrom";
    *(undefined8 *)((long)coroutine._M_fr_ptr + 0x5f8) = 0x110000090b;
    Promise<void>::fork((Promise<void> *)((long)coroutine._M_fr_ptr + 0x600));
    kj::_::ForkHub<kj::_::Void>::addBranch((ForkHub<kj::_::Void> *)&stack0xffffffffffffffa8);
    pPVar2 = (PromiseArenaMember *)input[2]._vptr_AsyncInputStream;
    input[2]._vptr_AsyncInputStream = (_func_int **)local_58;
    local_58 = (char *)0x0;
    if (pPVar2 != (PromiseArenaMember *)0x0) {
      kj::_::PromiseDisposer::dispose(pPVar2);
      node.exception = (Exception *)local_58;
      if ((Exception *)local_58 != (Exception *)0x0) {
        local_58 = (char *)0x0;
        kj::_::PromiseDisposer::dispose((PromiseArenaMember *)node.exception);
      }
    }
    kj::_::ForkedPromiseAwaiter<void>::ForkedPromiseAwaiter
              ((ForkedPromiseAwaiter<void> *)((long)coroutine._M_fr_ptr + 0x240),
               (ForkedPromise<void> *)((long)coroutine._M_fr_ptr + 0x600));
    *(undefined1 *)((long)coroutine._M_fr_ptr + 0x638) = 0;
    this_01 = (PromiseAwaiter<void> *)((long)coroutine._M_fr_ptr + 0x270);
    bVar4 = kj::_::PromiseAwaiterBase::awaitSuspendImpl
                      ((PromiseAwaiterBase *)this_01,(CoroutineBase *)this_00);
    if (!bVar4) {
      kj::_::PromiseAwaiter<void>::await_resume(this_01);
      if (*(char *)((long)coroutine._M_fr_ptr + 0x288) == '\x01') {
        Exception::~Exception((Exception *)((long)coroutine._M_fr_ptr + 0x290));
      }
      kj::_::PromiseAwaiterBase::~PromiseAwaiterBase((PromiseAwaiterBase *)this_01);
      kj::_::ForkBranchBase::~ForkBranchBase((ForkBranchBase *)((long)coroutine._M_fr_ptr + 0x240));
      promise = (Promise<unsigned_long> *)((long)coroutine._M_fr_ptr + 0x618);
      (**(code **)(**(long **)((long)coroutine._M_fr_ptr + 0x628) + 0x18))
                (promise,*(long **)((long)coroutine._M_fr_ptr + 0x628),
                 *(undefined8 *)(*(long *)((long)coroutine._M_fr_ptr + 0x620) + 8),
                 *(undefined8 *)((long)coroutine._M_fr_ptr + 0x630));
      __return_storage_ptr__ = (PromiseAwaiter<unsigned_long> *)((long)coroutine._M_fr_ptr + 0x428);
      co_await<unsigned_long>(__return_storage_ptr__,promise);
      *(undefined1 *)((long)coroutine._M_fr_ptr + 0x638) = 1;
      bVar4 = kj::_::PromiseAwaiterBase::awaitSuspendImpl
                        ((PromiseAwaiterBase *)__return_storage_ptr__,(CoroutineBase *)this_00);
      if (!bVar4) {
        uVar5 = kj::_::PromiseAwaiter<unsigned_long>::await_resume(__return_storage_ptr__);
        if (*(char *)((long)coroutine._M_fr_ptr + 0x440) == '\x01') {
          Exception::~Exception((Exception *)((long)coroutine._M_fr_ptr + 0x448));
        }
        kj::_::PromiseAwaiterBase::~PromiseAwaiterBase((PromiseAwaiterBase *)__return_storage_ptr__)
        ;
        pPVar2 = &((promise->super_PromiseBase).node.ptr)->super_PromiseArenaMember;
        if (pPVar2 != (PromiseArenaMember *)0x0) {
          (promise->super_PromiseBase).node.ptr = (PromiseNode *)0x0;
          kj::_::PromiseDisposer::dispose(pPVar2);
        }
        *(undefined1 *)(*(long *)((long)coroutine._M_fr_ptr + 0x620) + 0x1a) = 0;
        *(unsigned_long *)((long)coroutine._M_fr_ptr + 0x610) = uVar5;
        kj::_::Coroutine<unsigned_long>::fulfill
                  (this_00,(FixVoid<unsigned_long> *)((long)coroutine._M_fr_ptr + 0x610));
        plVar3 = *(long **)((long)coroutine._M_fr_ptr + 0x608);
        if (plVar3 != (long *)0x0) {
          *(undefined8 *)((long)coroutine._M_fr_ptr + 0x608) = 0;
          (**(code **)**(undefined8 **)((long)coroutine._M_fr_ptr + 0x600))
                    (*(undefined8 **)((long)coroutine._M_fr_ptr + 0x600),
                     (long)plVar3 + *(long *)(*plVar3 + -0x10));
        }
        *(undefined8 *)coroutine._M_fr_ptr = 0;
        *(undefined1 *)((long)coroutine._M_fr_ptr + 0x638) = 2;
      }
    }
    return (PromiseBase)(PromiseBase)this;
  }
  kj::_::Debug::Fault::Fault<kj::Exception::Type,kj::_::DebugExpression<bool&>&>
            ((Fault *)&stack0xffffffffffffffc0,
             "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/compat/http.c++"
             ,0x908,FAILED,"inBody","_kjCondition,",
             (DebugExpression<bool_&> *)&stack0xffffffffffffffa8);
  kj::_::Debug::Fault::fatal((Fault *)&stack0xffffffffffffffc0);
}

Assistant:

Promise<uint64_t> pumpBodyFrom(AsyncInputStream& input, uint64_t amount) {
    KJ_REQUIRE(!writeInProgress, "concurrent write()s not allowed");
    KJ_REQUIRE(inBody);

    writeInProgress = true;
    auto fork = writeQueue.fork();
    writeQueue = fork.addBranch();

    co_await fork;
    auto actual = co_await input.pumpTo(inner, amount);

    // We intentionally don't use KJ_DEFER to clean this up because if an exception is thrown, we
    // want to block further writes.
    writeInProgress = false;
    co_return actual;
  }